

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageErrorsTest::Test2DMultisample(StorageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar12;
  long lVar11;
  
  iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar10);
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar11 + 0x1460))(pEVar12,1,0x8229,8,8,0);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x502,"glTextureStorage2DMultisample",
                     "texture is not the name of an existing texture object.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar11 + 0x1460))(pEVar12,1,this->m_internalformat_invalid,8,8,0);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x500,"glTextureStorage2DMultisample",
                     "internalformat is not a valid sized internal format.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar11 + 0x1460))(pEVar12,1,0x8229,8,8,0);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x500,"glTextureStorage2DMultisample",
                     "the effective target of texture is not one of the accepted targets.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar11 + 0x1460))(pEVar12,1,0x8229,0,8,0);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage2DMultisample",
                     "width is less than 1.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar11 + 0x1460))(pEVar12,1,0x8229,8,0,0);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage2DMultisample",
                     "height is less than 1.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar11 + 0x1460))(pEVar12,1,0x8229,this->m_max_texture_size * 2,8,0);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage2DMultisample",
                     "width is greater than the value of MAX_TEXTURE_SIZE.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar11 + 0x1460))(pEVar12,1,0x8229,8,this->m_max_texture_size * 2,0);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage2DMultisample",
                     "height is greater than the value of MAX_TEXTURE_SIZE.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar11 + 0x1460))(pEVar12,this->m_max_samples * 2,0x8229,8,8,0);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x501,"glTextureStorage2DMultisample",
                     "samples is greater than the value of MAX_SAMPLES.");
  pEVar12 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms_immutable;
  (**(code **)(lVar11 + 0x1460))(pEVar12,1,0x8229,8,8,0);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar12,(this->super_TestCase).m_context,0x502,"glTextureStorage2DMultisample",
                     "samples is greater than the value of MAX_SAMPLES.");
  return (bVar9 && bVar8) && ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)))
  ;
}

Assistant:

bool StorageErrorsTest::Test2DMultisample()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/*  Check that INVALID_OPERATION is generated by TextureStorage2DMultisample
	 if texture is not the name of an existing texture object. */
	{
		gl.textureStorage2DMultisample(m_to_invalid, 1, GL_R8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage2DMultisample",
								  "texture is not the name of an existing texture object.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage2DMultisample if
	 internalformat is not a valid color-renderable, depth-renderable or
	 stencil-renderable format. */
	{
		gl.textureStorage2DMultisample(m_to_2D_ms, 1, m_internalformat_invalid, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage2DMultisample",
								  "internalformat is not a valid sized internal format.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage2DMultisample if
	 target or the effective target of texture is not one of the accepted
	 targets described above. */
	{
		gl.textureStorage2DMultisample(m_to_1D, 1, GL_R8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage2DMultisample",
								  "the effective target of texture is not one of the accepted targets.");
	}

	/* Check that INVALID_VALUE is generated by TextureStorage2DMultisample if
	 width or height are less than 1 or greater than the value of
	 MAX_TEXTURE_SIZE. */
	{
		gl.textureStorage2DMultisample(m_to_2D_ms, 1, GL_R8, 0, 8, false);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage2DMultisample", "width is less than 1.");

		gl.textureStorage2DMultisample(m_to_2D_ms, 1, GL_R8, 8, 0, false);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage2DMultisample", "height is less than 1.");

		gl.textureStorage2DMultisample(m_to_2D_ms, 1, GL_R8, m_max_texture_size * 2, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage2DMultisample",
								  "width is greater than the value of MAX_TEXTURE_SIZE.");

		gl.textureStorage2DMultisample(m_to_2D_ms, 1, GL_R8, 8, m_max_texture_size * 2, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage2DMultisample",
								  "height is greater than the value of MAX_TEXTURE_SIZE.");
	}

	/* Check that INVALID_VALUE is generated by TextureStorage2DMultisample if
	 samples is greater than the value of MAX_SAMPLES. */
	{
		gl.textureStorage2DMultisample(m_to_2D_ms, m_max_samples * 2, GL_R8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage2DMultisample",
								  "samples is greater than the value of MAX_SAMPLES.");
	}

	/* Check that INVALID_OPERATION is generated by TextureStorage2DMultisample
	 if the value of TEXTURE_IMMUTABLE_FORMAT for the texture bound to target
	 is not FALSE. */
	{
		gl.textureStorage2DMultisample(m_to_2D_ms_immutable, 1, GL_R8, 8, 8, false);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage2DMultisample",
								  "samples is greater than the value of MAX_SAMPLES.");
	}

	return is_ok;
}